

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfile.c
# Opt level: O1

pboolean p_file_remove(pchar *file,PError **error)

{
  int iVar1;
  uint uVar2;
  
  if (file == (pchar *)0x0) {
    p_file_remove_cold_2();
    uVar2 = 0;
  }
  else {
    iVar1 = unlink(file);
    uVar2 = (uint)(iVar1 == 0);
    if (iVar1 != 0) {
      p_file_remove_cold_1();
    }
  }
  return uVar2;
}

Assistant:

P_LIB_API pboolean
p_file_remove (const pchar	*file,
	       PError		**error)
{
	pboolean result;

	if (P_UNLIKELY (file == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

#ifdef P_OS_WIN
	result = (DeleteFileA ((LPCSTR) file) != 0);
#else
	result = (unlink (file) == 0);
#endif

	if (P_UNLIKELY (!result))
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to remove file");

	return result;
}